

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::SynchronizeSegmentDomains(ON_PolyCurve *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ON_Curve **ppOVar6;
  double *pdVar7;
  bool rc;
  double *t;
  ON_Curve **c;
  int count;
  int i;
  double t1;
  double t0;
  ON_PolyCurve *this_local;
  
  t0 = (double)this;
  iVar3 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  ppOVar6 = ON_SimpleArray<ON_Curve_*>::Array(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  if ((iVar3 < 1) || (ppOVar6 == (ON_Curve **)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    iVar4 = ON_SimpleArray<double>::Count(&this->m_t);
    if (iVar3 + 1 == iVar4) {
      pdVar7 = ON_SimpleArray<double>::Array(&this->m_t);
      if (pdVar7 == (double *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = false;
        for (c._4_4_ = 0; this_local._7_1_ = bVar1, c._4_4_ < iVar3; c._4_4_ = c._4_4_ + 1) {
          if (ppOVar6[c._4_4_] != (ON_Curve *)0x0) {
            t1 = 1.23432101234321e+308;
            _count = -1.23432101234321e+308;
            bVar2 = ON_Curve::GetDomain(ppOVar6[c._4_4_],&t1,(double *)&count);
            if (bVar2) {
              if ((t1 == pdVar7[c._4_4_]) && (!NAN(t1) && !NAN(pdVar7[c._4_4_]))) {
                if ((_count == pdVar7[c._4_4_ + 1]) && (!NAN(_count) && !NAN(pdVar7[c._4_4_ + 1])))
                goto LAB_00803999;
              }
            }
            bVar2 = ON_IsValid(pdVar7[c._4_4_]);
            if ((((bVar2) && (bVar2 = ON_IsValid(pdVar7[c._4_4_ + 1]), bVar2)) &&
                (pdVar7[c._4_4_] < pdVar7[c._4_4_ + 1])) &&
               (uVar5 = (*(ppOVar6[c._4_4_]->super_ON_Geometry).super_ON_Object._vptr_ON_Object
                          [0x26])(pdVar7[c._4_4_],pdVar7[c._4_4_ + 1]), (uVar5 & 1) != 0)) {
              bVar1 = true;
            }
          }
LAB_00803999:
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyCurve::SynchronizeSegmentDomains()
{
  double t0, t1;
  int i, count = m_segment.Count();
  ON_Curve** c = m_segment.Array();
  if ( count < 1 || 0 == c )
    return false;
  if ( count+1 != m_t.Count() )
    return false;
  const double* t = m_t.Array();
  if ( 0 == t )
    return false;

  bool rc = false;
  for ( i = 0; i < count; i++ )
  {
    if ( !c[i] )
      continue;
    t0 = -ON_UNSET_VALUE;
    t1 = ON_UNSET_VALUE;
    if ( c[i]->GetDomain(&t0,&t1) 
         && t0 == t[i]
         && t1 == t[i+1]
         )
    {
     continue;
    }

    if (    ON_IsValid(t[i]) 
        && ON_IsValid(t[i+1])
        && t[i] < t[i+1] 
        && c[i]->SetDomain(t[i],t[i+1]) 
      )
    {
     rc = true; // indicates a change was made
    }
  }
  return rc;
}